

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_functions.cc
# Opt level: O1

float __thiscall
squaredloss::getLoss(squaredloss *this,shared_data *sd,float prediction,float label)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = sd->max_label;
  if ((fVar2 < prediction) || (prediction < sd->min_label)) {
    fVar3 = sd->min_label;
    fVar1 = 0.0;
    if (fVar3 <= prediction) {
      if ((fVar2 != label) || (NAN(fVar2) || NAN(label))) {
        fVar3 = fVar2 - label;
        fVar1 = (prediction - fVar2) * (fVar3 + fVar3) + fVar3 * fVar3;
      }
    }
    else if ((fVar3 != label) || (fVar1 = 0.0, NAN(fVar3) || NAN(label))) {
      fVar2 = label - fVar3;
      fVar1 = (fVar3 - prediction) * (fVar2 + fVar2) + fVar2 * fVar2;
    }
  }
  else {
    fVar1 = (prediction - label) * (prediction - label);
  }
  return fVar1;
}

Assistant:

float getLoss(shared_data* sd, float prediction, float label)
  {
    if (prediction <= sd->max_label && prediction >= sd->min_label)
    {
      float example_loss = (prediction - label) * (prediction - label);
      return example_loss;
    }
    else if (prediction < sd->min_label)
      if (label == sd->min_label)
        return 0.;
      else
        return (float)((label - sd->min_label) * (label - sd->min_label) +
            2. * (label - sd->min_label) * (sd->min_label - prediction));
    else if (label == sd->max_label)
      return 0.;
    else
      return float((sd->max_label - label) * (sd->max_label - label) +
          2. * (sd->max_label - label) * (prediction - sd->max_label));
  }